

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_button_image_styled(nk_context *ctx,nk_style_button *style,nk_image img)

{
  nk_key nVar1;
  nk_rect bounds_00;
  nk_image img_00;
  nk_button_behavior b;
  nk_input *in_RDI;
  undefined8 unaff_retaddr;
  nk_widget_layout_states state;
  nk_rect bounds;
  nk_input *in;
  nk_panel *layout;
  nk_window *win;
  nk_input *in_00;
  nk_style_button *style_00;
  nk_context *in_stack_ffffffffffffffc0;
  nk_rect *in_stack_ffffffffffffffc8;
  long lVar2;
  float fVar3;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  nk_bool nVar4;
  
  style_00 = (nk_style_button *)&stack0x00000008;
  if (((in_RDI == (nk_input *)0x0) || (in_RDI[0x2e].keyboard.keys[5] == (nk_key)0x0)) ||
     (*(long *)((long)in_RDI[0x2e].keyboard.keys[5] + 0xa8) == 0)) {
    nVar4 = 0;
  }
  else {
    nVar1 = in_RDI[0x2e].keyboard.keys[5];
    fVar3 = (float)nVar1.down;
    lVar2 = *(long *)((long)nVar1 + 0xa8);
    b = nk_widget(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    if (b == NK_BUTTON_DEFAULT) {
      nVar4 = 0;
    }
    else {
      if ((b == 2) || (in_00 = in_RDI, (*(uint *)(lVar2 + 4) & 0x1000) != 0)) {
        in_00 = (nk_input *)0x0;
      }
      bounds_00.y = (float)(int)lVar2;
      bounds_00.w = (float)(int)((ulong)lVar2 >> 0x20);
      bounds_00.x = (float)(int)((ulong)in_00 >> 0x20);
      bounds_00.h = fVar3;
      img_00.w = (short)in_stack_fffffffffffffff8;
      img_00.h = (short)((uint)in_stack_fffffffffffffff8 >> 0x10);
      img_00.handle.ptr = in_RDI;
      img_00.region[0] = (short)in_stack_fffffffffffffffc;
      img_00.region[1] = (short)((uint)in_stack_fffffffffffffffc >> 0x10);
      img_00._16_8_ = unaff_retaddr;
      nVar4 = nk_do_button_image((nk_flags *)in_stack_ffffffffffffffc8,
                                 (nk_command_buffer *)in_stack_ffffffffffffffc0,bounds_00,img_00,b,
                                 style_00,in_00);
    }
  }
  return nVar4;
}

Assistant:

NK_API nk_bool
nk_button_image_styled(struct nk_context *ctx, const struct nk_style_button *style,
struct nk_image img)
{
struct nk_window *win;
struct nk_panel *layout;
const struct nk_input *in;

struct nk_rect bounds;
enum nk_widget_layout_states state;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return 0;

win = ctx->current;
layout = win->layout;

state = nk_widget(&bounds, ctx);
if (!state) return 0;
in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
return nk_do_button_image(&ctx->last_widget_state, &win->buffer, bounds,
img, ctx->button_behavior, style, in);
}